

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O2

word Gia_ObjComputeTruthTable6(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSupp,Vec_Wrd_t *vTruths)

{
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pObj_00;
  char *__assertion;
  long lVar3;
  word *pwVar4;
  
  if (vSupp->nSize < 7) {
    uVar1 = (uint)*(undefined8 *)pObj;
    if (((int)uVar1 < 0) || ((uVar1 & 0x1fffffff) == 0x1fffffff)) {
      __assertion = "Gia_ObjIsAnd(pObj)";
      uVar1 = 0x7d;
    }
    else {
      if ((uVar1 >> 0x1e & 1) == 0) {
        vTruths->nSize = 0;
        Gia_ManIncrementTravId(p);
        pwVar4 = s_Truth6;
        for (lVar3 = 0; lVar3 < vSupp->nSize; lVar3 = lVar3 + 1) {
          iVar2 = Vec_IntEntry(vSupp,(int)lVar3);
          pObj_00 = Gia_ManObj(p,iVar2);
          if (pObj_00 == (Gia_Obj_t *)0x0) break;
          if (((uint)*(undefined8 *)pObj_00 >> 0x1e & 1) == 0) {
            if ((~(uint)*(undefined8 *)pObj_00 & 0x9fffffff) != 0) {
LAB_005dd42d:
              __assert_fail("pLeaf->fMark0 || Gia_ObjIsRo(p, pLeaf)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTruth.c"
                            ,0x83,
                            "word Gia_ObjComputeTruthTable6(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Wrd_t *)"
                           );
            }
            iVar2 = Gia_ObjCioId(pObj_00);
            if (iVar2 < p->vCis->nSize - p->nRegs) goto LAB_005dd42d;
          }
          pObj_00->Value = vTruths->nSize;
          Vec_WrdPush(vTruths,*pwVar4);
          Gia_ObjSetTravIdCurrent(p,pObj_00);
          pwVar4 = pwVar4 + 1;
        }
        Gia_ObjComputeTruthTable6_rec(p,pObj,vTruths);
        if (0 < (long)vTruths->nSize) {
          return vTruths->pArray[(long)vTruths->nSize + -1];
        }
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                      ,0x1d0,"word Vec_WrdEntryLast(Vec_Wrd_t *)");
      }
      __assertion = "!pObj->fMark0";
      uVar1 = 0x7e;
    }
  }
  else {
    __assertion = "Vec_IntSize(vSupp) <= 6";
    uVar1 = 0x7c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTruth.c"
                ,uVar1,
                "word Gia_ObjComputeTruthTable6(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Wrd_t *)"
               );
}

Assistant:

word Gia_ObjComputeTruthTable6( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSupp, Vec_Wrd_t * vTruths )
{
    Gia_Obj_t * pLeaf;
    int i;
    assert( Vec_IntSize(vSupp) <= 6 );
    assert( Gia_ObjIsAnd(pObj) );
    assert( !pObj->fMark0 );
    Vec_WrdClear( vTruths );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachObjVec( vSupp, p, pLeaf, i )
    {
        assert( pLeaf->fMark0 || Gia_ObjIsRo(p, pLeaf) );
        pLeaf->Value = Vec_WrdSize(vTruths);
        Vec_WrdPush( vTruths, s_Truth6[i] );
        Gia_ObjSetTravIdCurrent(p, pLeaf);
    }
    Gia_ObjComputeTruthTable6_rec( p, pObj, vTruths );
    return Vec_WrdEntryLast( vTruths );
}